

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O2

void ogt_stream_from_paletted_voxels_simple
               (uint8_t *voxels,uint32_t size_x,uint32_t size_y,uint32_t size_z,
               ogt_mesh_rgba *palette,ogt_voxel_simple_stream_func stream_func,
               void *stream_func_data)

{
  byte bVar1;
  ogt_mesh_rgba oVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ogt_mesh_vertex *poVar9;
  uint32_t uVar10;
  int iVar11;
  uint32_t uVar12;
  long lVar13;
  int32_t j;
  uint32_t uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint32_t local_index [36];
  ogt_mesh_vertex local_vertex [24];
  
  if (stream_func != (ogt_voxel_simple_stream_func)0x0) {
    uVar8 = 0;
    uVar10 = 0;
    if (0 < (int)size_x) {
      uVar10 = size_x;
    }
    uVar4 = size_y;
    if ((int)size_y < 1) {
      uVar4 = uVar8;
    }
    uVar3 = size_z;
    if ((int)size_z < 1) {
      uVar3 = uVar8;
    }
    uVar6 = 0;
    for (; uVar8 != uVar3; uVar8 = uVar8 + 1) {
      fVar23 = (float)(int)uVar8;
      fVar24 = fVar23 + 1.0;
      for (uVar14 = 0; uVar14 != uVar4; uVar14 = uVar14 + 1) {
        fVar25 = (float)(int)uVar14;
        fVar26 = fVar25 + 1.0;
        for (lVar13 = 0; uVar12 = (uint32_t)lVar13, uVar10 != uVar12; lVar13 = lVar13 + 1) {
          bVar1 = voxels[lVar13];
          if ((ulong)bVar1 != 0) {
            fVar21 = (float)(int)uVar12;
            fVar22 = fVar21 + 1.0;
            bVar16 = true;
            bVar15 = true;
            if (uVar12 != 0) {
              bVar15 = voxels[lVar13 + -1] == '\0';
            }
            if (size_x - 1 != uVar12) {
              bVar16 = voxels[lVar13 + 1] == '\0';
            }
            bVar18 = true;
            bVar17 = true;
            if (uVar14 != 0) {
              bVar17 = voxels[lVar13 + (int)-size_x] == '\0';
            }
            if (uVar14 != size_y - 1) {
              bVar18 = voxels[lVar13 + (int)size_x] == '\0';
            }
            bVar20 = true;
            bVar19 = true;
            if (uVar8 != 0) {
              bVar19 = voxels[lVar13 + (int)-(size_y * size_x)] == '\0';
            }
            if (uVar8 != size_z - 1) {
              bVar20 = voxels[lVar13 + (int)(size_y * size_x)] == '\0';
            }
            iVar11 = (uint)bVar17 + (uint)bVar18 + (uint)bVar16 + (uint)bVar15 + (uint)bVar19 +
                     (uint)bVar20;
            if (iVar11 != 0) {
              oVar2 = palette[bVar1];
              if (bVar15 == 0) {
                puVar5 = local_index;
                poVar9 = local_vertex;
                uVar7 = uVar6;
              }
              else {
                local_vertex[0].normal.x = -1.0;
                local_vertex[0].normal.y = 0.0;
                local_vertex[0].normal.z = 0.0;
                local_vertex[0].palette_index = (uint32_t)bVar1;
                local_vertex[1].pos.y = fVar26;
                local_vertex[1].pos.x = fVar21;
                local_vertex[1].normal.x = -1.0;
                local_vertex[1].normal.y = 0.0;
                local_vertex[1].normal.z = 0.0;
                local_vertex[1].palette_index = (uint32_t)voxels[lVar13];
                local_vertex[2].pos.y = fVar26;
                local_vertex[2].pos.x = fVar21;
                local_vertex[2].normal.x = -1.0;
                local_vertex[2].normal.y = 0.0;
                local_vertex[2].normal.z = 0.0;
                local_vertex[2].palette_index = (uint32_t)voxels[lVar13];
                local_vertex[3].normal.x = -1.0;
                local_vertex[3].normal.y = 0.0;
                local_vertex[3].normal.z = 0.0;
                local_vertex[3].palette_index = (uint32_t)voxels[lVar13];
                local_index[0] = uVar6 + 2;
                local_index[1] = uVar6 + 1;
                local_index[4] = uVar6 + 3;
                puVar5 = local_index + 6;
                poVar9 = local_vertex + 4;
                uVar7 = uVar6 + 4;
                local_index[2] = uVar6;
                local_index[3] = uVar6;
                local_index[5] = local_index[0];
                local_vertex[0].pos.x = fVar21;
                local_vertex[0].pos.y = fVar25;
                local_vertex[0].pos.z = fVar23;
                local_vertex[0].color = oVar2;
                local_vertex[1].pos.z = fVar23;
                local_vertex[1].color = oVar2;
                local_vertex[2].pos.z = fVar24;
                local_vertex[2].color = oVar2;
                local_vertex[3].pos.x = fVar21;
                local_vertex[3].pos.y = fVar25;
                local_vertex[3].pos.z = fVar24;
                local_vertex[3].color = oVar2;
              }
              if (bVar16 != 0) {
                bVar1 = voxels[lVar13];
                (poVar9->pos).x = fVar22;
                (poVar9->pos).y = fVar25;
                (poVar9->pos).z = fVar23;
                (poVar9->normal).x = 1.0;
                (poVar9->normal).y = 0.0;
                (poVar9->normal).z = 0.0;
                poVar9->color = oVar2;
                poVar9->palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[1].pos.x = fVar22;
                poVar9[1].pos.y = fVar26;
                poVar9[1].pos.z = fVar23;
                poVar9[1].normal.x = 1.0;
                poVar9[1].normal.y = 0.0;
                poVar9[1].normal.z = 0.0;
                poVar9[1].color = oVar2;
                poVar9[1].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[2].pos.x = fVar22;
                poVar9[2].pos.y = fVar26;
                poVar9[2].pos.z = fVar24;
                poVar9[2].normal.x = 1.0;
                poVar9[2].normal.y = 0.0;
                poVar9[2].normal.z = 0.0;
                poVar9[2].color = oVar2;
                poVar9[2].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[3].pos.x = fVar22;
                poVar9[3].pos.y = fVar25;
                poVar9[3].pos.z = fVar24;
                poVar9[3].normal.x = 1.0;
                poVar9[3].normal.y = 0.0;
                poVar9[3].normal.z = 0.0;
                poVar9[3].color = oVar2;
                poVar9[3].palette_index = (uint)bVar1;
                *puVar5 = uVar7;
                puVar5[1] = uVar7 + 1;
                puVar5[2] = uVar7 + 2;
                puVar5[3] = uVar7 + 2;
                puVar5[4] = uVar7 + 3;
                puVar5[5] = uVar7;
                uVar7 = uVar7 + 4;
                poVar9 = poVar9 + 4;
                puVar5 = puVar5 + 6;
              }
              if (bVar17 != false) {
                bVar1 = voxels[lVar13];
                (poVar9->pos).x = fVar21;
                (poVar9->pos).y = fVar25;
                (poVar9->pos).z = fVar23;
                (poVar9->normal).x = 0.0;
                (poVar9->normal).y = -1.0;
                (poVar9->normal).z = 0.0;
                poVar9->color = oVar2;
                poVar9->palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[1].pos.x = fVar22;
                poVar9[1].pos.y = fVar25;
                poVar9[1].pos.z = fVar23;
                poVar9[1].normal.x = 0.0;
                poVar9[1].normal.y = -1.0;
                poVar9[1].normal.z = 0.0;
                poVar9[1].color = oVar2;
                poVar9[1].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[2].pos.x = fVar22;
                poVar9[2].pos.y = fVar25;
                poVar9[2].pos.z = fVar24;
                poVar9[2].normal.x = 0.0;
                poVar9[2].normal.y = -1.0;
                poVar9[2].normal.z = 0.0;
                poVar9[2].color = oVar2;
                poVar9[2].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[3].pos.x = fVar21;
                poVar9[3].pos.y = fVar25;
                poVar9[3].pos.z = fVar24;
                poVar9[3].normal.x = 0.0;
                poVar9[3].normal.y = -1.0;
                poVar9[3].normal.z = 0.0;
                poVar9[3].color = oVar2;
                poVar9[3].palette_index = (uint)bVar1;
                *puVar5 = uVar7;
                puVar5[1] = uVar7 + 1;
                puVar5[2] = uVar7 + 2;
                puVar5[3] = uVar7 + 2;
                puVar5[4] = uVar7 + 3;
                puVar5[5] = uVar7;
                uVar7 = uVar7 + 4;
                poVar9 = poVar9 + 4;
                puVar5 = puVar5 + 6;
              }
              if (bVar18 != false) {
                bVar1 = voxels[lVar13];
                (poVar9->pos).x = fVar21;
                (poVar9->pos).y = fVar26;
                (poVar9->pos).z = fVar23;
                (poVar9->normal).x = 0.0;
                (poVar9->normal).y = 1.0;
                (poVar9->normal).z = 0.0;
                poVar9->color = oVar2;
                poVar9->palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[1].pos.x = fVar22;
                poVar9[1].pos.y = fVar26;
                poVar9[1].pos.z = fVar23;
                poVar9[1].normal.x = 0.0;
                poVar9[1].normal.y = 1.0;
                poVar9[1].normal.z = 0.0;
                poVar9[1].color = oVar2;
                poVar9[1].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[2].pos.x = fVar22;
                poVar9[2].pos.y = fVar26;
                poVar9[2].pos.z = fVar24;
                poVar9[2].normal.x = 0.0;
                poVar9[2].normal.y = 1.0;
                poVar9[2].normal.z = 0.0;
                poVar9[2].color = oVar2;
                poVar9[2].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[3].pos.x = fVar21;
                poVar9[3].pos.y = fVar26;
                poVar9[3].pos.z = fVar24;
                poVar9[3].normal.x = 0.0;
                poVar9[3].normal.y = 1.0;
                poVar9[3].normal.z = 0.0;
                poVar9[3].color = oVar2;
                poVar9[3].palette_index = (uint)bVar1;
                *puVar5 = uVar7 + 2;
                puVar5[1] = uVar7 + 1;
                puVar5[2] = uVar7;
                puVar5[3] = uVar7;
                puVar5[4] = uVar7 + 3;
                puVar5[5] = uVar7 + 2;
                uVar7 = uVar7 + 4;
                poVar9 = poVar9 + 4;
                puVar5 = puVar5 + 6;
              }
              if (bVar19 != 0) {
                bVar1 = voxels[lVar13];
                (poVar9->pos).x = fVar21;
                (poVar9->pos).y = fVar25;
                (poVar9->pos).z = fVar23;
                (poVar9->normal).x = 0.0;
                (poVar9->normal).y = 0.0;
                (poVar9->normal).z = -1.0;
                poVar9->color = oVar2;
                poVar9->palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[1].pos.x = fVar22;
                poVar9[1].pos.y = fVar25;
                poVar9[1].pos.z = fVar23;
                poVar9[1].normal.x = 0.0;
                poVar9[1].normal.y = 0.0;
                poVar9[1].normal.z = -1.0;
                poVar9[1].color = oVar2;
                poVar9[1].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[2].pos.x = fVar22;
                poVar9[2].pos.y = fVar26;
                poVar9[2].pos.z = fVar23;
                poVar9[2].normal.x = 0.0;
                poVar9[2].normal.y = 0.0;
                poVar9[2].normal.z = -1.0;
                poVar9[2].color = oVar2;
                poVar9[2].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[3].pos.x = fVar21;
                poVar9[3].pos.y = fVar26;
                poVar9[3].pos.z = fVar23;
                poVar9[3].normal.x = 0.0;
                poVar9[3].normal.y = 0.0;
                poVar9[3].normal.z = -1.0;
                poVar9[3].color = oVar2;
                poVar9[3].palette_index = (uint)bVar1;
                *puVar5 = uVar7 + 2;
                puVar5[1] = uVar7 + 1;
                puVar5[2] = uVar7;
                puVar5[3] = uVar7;
                puVar5[4] = uVar7 + 3;
                puVar5[5] = uVar7 + 2;
                uVar7 = uVar7 + 4;
                poVar9 = poVar9 + 4;
                puVar5 = puVar5 + 6;
              }
              if (bVar20 != false) {
                bVar1 = voxels[lVar13];
                (poVar9->pos).x = fVar21;
                (poVar9->pos).y = fVar25;
                (poVar9->pos).z = fVar24;
                (poVar9->normal).x = 0.0;
                (poVar9->normal).y = 0.0;
                (poVar9->normal).z = 1.0;
                poVar9->color = oVar2;
                poVar9->palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[1].pos.x = fVar22;
                poVar9[1].pos.y = fVar25;
                poVar9[1].pos.z = fVar24;
                poVar9[1].normal.x = 0.0;
                poVar9[1].normal.y = 0.0;
                poVar9[1].normal.z = 1.0;
                poVar9[1].color = oVar2;
                poVar9[1].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[2].pos.x = fVar22;
                poVar9[2].pos.y = fVar26;
                poVar9[2].pos.z = fVar24;
                poVar9[2].normal.x = 0.0;
                poVar9[2].normal.y = 0.0;
                poVar9[2].normal.z = 1.0;
                poVar9[2].color = oVar2;
                poVar9[2].palette_index = (uint)bVar1;
                bVar1 = voxels[lVar13];
                poVar9[3].pos.x = fVar21;
                poVar9[3].pos.y = fVar26;
                poVar9[3].pos.z = fVar24;
                poVar9[3].normal.x = 0.0;
                poVar9[3].normal.y = 0.0;
                poVar9[3].normal.z = 1.0;
                poVar9[3].color = oVar2;
                poVar9[3].palette_index = (uint)bVar1;
                *puVar5 = uVar7;
                puVar5[1] = uVar7 + 1;
                puVar5[2] = uVar7 + 2;
                puVar5[3] = uVar7 + 2;
                puVar5[4] = uVar7 + 3;
                puVar5[5] = uVar7;
                uVar7 = uVar7 + 4;
              }
              (*stream_func)(uVar12,uVar14,uVar8,local_vertex,iVar11 * 4,local_index,iVar11 * 6,
                             stream_func_data);
              uVar6 = uVar7;
            }
          }
        }
        voxels = voxels + lVar13;
      }
    }
    return;
  }
  __assert_fail("stream_func",
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                ,0x24b,
                "void ogt_stream_from_paletted_voxels_simple(const uint8_t *, uint32_t, uint32_t, uint32_t, const ogt_mesh_rgba *, ogt_voxel_simple_stream_func, void *)"
               );
}

Assistant:

void ogt_stream_from_paletted_voxels_simple(
    const uint8_t* voxels, uint32_t size_x, uint32_t size_y, uint32_t size_z, const ogt_mesh_rgba* palette,
    ogt_voxel_simple_stream_func stream_func, void* stream_func_data) 
{
    assert(stream_func);
    const int32_t k_stride_x = 1;
    const int32_t k_stride_y = size_x;
    const int32_t k_stride_z = size_x * size_y;
    const int32_t k_max_x = size_x - 1;
    const int32_t k_max_y = size_y - 1;
    const int32_t k_max_z = size_z - 1;
    
    const uint8_t* current_voxel = voxels;

    uint32_t total_vertex_count = 0;
    uint32_t total_index_count = 0;
    for (int32_t k = 0; k < (int32_t)size_z; k++)
    {
        const float min_z = (float)k;
        const float max_z = min_z + 1.0f;
        for (int32_t j = 0; j < (int32_t)size_y; j++)
        {
            const float min_y = (float)j;
            const float max_y = min_y + 1.0f;
            for (int32_t i = 0; i < (int32_t)size_x; i++, current_voxel++)
            {
                // current voxel slot is empty? skip it.
                if (current_voxel[0] == 0)
                    continue;

                ogt_mesh_rgba color = palette[ current_voxel[0]];
                
                // determine the min/max coords of the voxel for each dimension.
                const float min_x = (float)i;
                const float max_x = min_x + 1.0f;

                // determine which faces we need to generate
                uint32_t neg_x = ((i == 0)       || (current_voxel[-k_stride_x] == 0));
                uint32_t pos_x = ((i == k_max_x) || (current_voxel[ k_stride_x] == 0));
                uint32_t neg_y = ((j == 0)       || (current_voxel[-k_stride_y] == 0));
                uint32_t pos_y = ((j == k_max_y) || (current_voxel[ k_stride_y] == 0));
                uint32_t neg_z = ((k == 0)       || (current_voxel[-k_stride_z] == 0));
                uint32_t pos_z = ((k == k_max_z) || (current_voxel[ k_stride_z] == 0));

                // count the number of faces. skip if zero.
                const uint32_t face_count_needed = (neg_x + pos_x + neg_y + pos_y + neg_z + pos_z);
                if (!face_count_needed)
                    continue;

                // generate geometry for this voxel to a local buffer first.
                ogt_mesh_vertex  local_vertex[24];
                uint32_t         local_index[36];
                ogt_mesh_vertex* current_vertex = local_vertex;
                uint32_t*        current_index  = local_index;

                // -X direction face
                if (neg_x)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, min_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( min_x, max_y, min_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( min_x, max_y, max_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, min_y, max_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 2;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 0;
                    current_index[3] = total_vertex_count + 0;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 2;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                
                // +X direction face
                if (pos_x)
                {
                    current_vertex[0] = _mesh_make_vertex( max_x, min_y, min_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, max_y, min_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, max_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( max_x, min_y, max_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 0;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 2;
                    current_index[3] = total_vertex_count + 2;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 0;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                
                // -Y direction face
                if (neg_y)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, min_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, min_y, min_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, min_y, max_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, min_y, max_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 0;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 2;
                    current_index[3] = total_vertex_count + 2;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 0;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                // +Y direction face
                if (pos_y)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, max_y, min_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, max_y, min_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, max_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, max_y, max_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 2;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 0;
                    current_index[3] = total_vertex_count + 0;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 2;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
               }
                // -Z direction face
                if (neg_z)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, min_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, max_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 2;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 0;
                    current_index[3] = total_vertex_count + 0;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 2;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                // +Z direction face
                if (pos_z)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, min_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, max_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 0;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 2;
                    current_index[3] = total_vertex_count + 2;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 0;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }

                // geometry for this voxel is provided to a caller-specified stream function/callback
                stream_func(i, j, k, local_vertex, face_count_needed*4, local_index, face_count_needed*6, stream_func_data);
            }
        }
    }	

}